

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void test_fixed_wnaf_small_helper(int *wnaf,int *wnaf_expected,int w)

{
  undefined1 *puVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  secp256k1_scratch_space *scratch;
  long lVar5;
  code *pcVar6;
  secp256k1_ge *psVar7;
  long extraout_RDX;
  secp256k1_ge *scratch_00;
  size_t sVar8;
  secp256k1_gej *r;
  ulong uVar9;
  secp256k1_strauss_point_state *psVar10;
  uchar *out32;
  secp256k1_sha256 *psVar11;
  secp256k1_gej *psVar12;
  secp256k1_ge *b;
  secp256k1_gej *psVar13;
  secp256k1_gej *psVar14;
  code *cb;
  secp256k1_ge *cbdata;
  secp256k1_fe *unaff_R12;
  secp256k1_callback *error_callback;
  secp256k1_sha256 *hash;
  secp256k1_ge *unaff_R13;
  secp256k1_scalar *psVar15;
  secp256k1_sha256 *psVar16;
  bool bVar17;
  ulong uStack_2388;
  secp256k1_strauss_state sStack_2380;
  secp256k1_strauss_point_state sStack_2368;
  secp256k1_fe asStack_1f58 [8];
  secp256k1_ge asStack_1dd8 [8];
  secp256k1_gej *psStack_1a90;
  secp256k1_callback *psStack_1a88;
  secp256k1_ge *psStack_1a78;
  secp256k1_strauss_point_state *psStack_1a70;
  secp256k1_scalar *psStack_1a68;
  undefined1 auStack_1a50 [8];
  undefined1 auStack_1a48 [176];
  secp256k1_gej sStack_1998;
  secp256k1_gej sStack_1900;
  secp256k1_gej sStack_1868;
  secp256k1_gej sStack_17d0;
  secp256k1_gej sStack_1738;
  secp256k1_gej asStack_16a0 [2];
  secp256k1_gej asStack_1520 [5];
  secp256k1_strauss_point_state sStack_11e0;
  secp256k1_scratch_space *psStack_dc8;
  secp256k1_sha256 *psStack_dc0;
  undefined1 *puStack_db8;
  secp256k1_gej *psStack_db0;
  secp256k1_gej *psStack_da8;
  code *pcStack_da0;
  undefined4 uStack_d8e;
  undefined2 uStack_d8a;
  secp256k1_gej *psStack_d88;
  long lStack_d80;
  undefined1 auStack_d78 [40];
  undefined8 uStack_d50;
  uint64_t uStack_d48;
  uint64_t uStack_d40;
  secp256k1_sha256 sStack_d38;
  secp256k1_sha256 sStack_cc8;
  secp256k1_gej *psStack_c60;
  secp256k1_fe *psStack_c58;
  secp256k1_ge *psStack_c50;
  secp256k1_ge *psStack_c48;
  secp256k1_gej *psStack_c40;
  secp256k1_strauss_point_state *psStack_c38;
  undefined1 auStack_c30 [32];
  undefined1 auStack_c10 [40];
  secp256k1_ge *psStack_be8;
  secp256k1_strauss_point_state *psStack_be0;
  secp256k1_gej sStack_bd8;
  secp256k1_gej sStack_b40;
  secp256k1_gej sStack_aa8;
  secp256k1_ge sStack_a10;
  secp256k1_gej sStack_9a8;
  secp256k1_fe asStack_910 [8];
  secp256k1_ge asStack_790 [8];
  secp256k1_strauss_point_state sStack_450;
  
  uVar4 = 0x20;
  do {
    uVar2 = (int)uVar4 - 1;
    uVar4 = (ulong)uVar2;
    if (wnaf[uVar4] != 0) {
      test_fixed_wnaf_small_helper_cold_1();
      goto LAB_0014e8c7;
    }
  } while (8 < uVar2);
  uVar2 = 7;
  while (wnaf[uVar2] == wnaf_expected[uVar2]) {
    bVar17 = uVar2 == 0;
    uVar2 = uVar2 - 1;
    if (bVar17) {
      return;
    }
  }
LAB_0014e8c7:
  test_fixed_wnaf_small_helper_cold_2();
  psVar14 = (secp256k1_gej *)auStack_c30;
  psVar10 = (secp256k1_strauss_point_state *)((ulong)wnaf_expected & 0xffffffff);
  psVar15 = (secp256k1_scalar *)auStack_c10;
  psStack_c38 = (secp256k1_strauss_point_state *)0x14e8ef;
  testutil_random_scalar_order_test(psVar15);
  psStack_c38 = (secp256k1_strauss_point_state *)0x14e900;
  secp256k1_scalar_add((secp256k1_scalar *)auStack_c30,psVar15,(secp256k1_scalar *)wnaf);
  psStack_c38 = (secp256k1_strauss_point_state *)0x14e90b;
  secp256k1_scalar_negate((secp256k1_scalar *)auStack_c30,(secp256k1_scalar *)auStack_c30);
  if ((int)wnaf_expected == 0) {
    psStack_c38 = (secp256k1_strauss_point_state *)0x14ea04;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_aa8,(secp256k1_scalar *)auStack_c10);
    psStack_c38 = (secp256k1_strauss_point_state *)0x14ea1b;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_b40,(secp256k1_scalar *)auStack_c30);
    psStack_c38 = (secp256k1_strauss_point_state *)0x14ea2f;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_bd8,(secp256k1_scalar *)wnaf);
  }
  else {
    psStack_c38 = (secp256k1_strauss_point_state *)0x14e923;
    testutil_random_ge_test(&sStack_a10);
    psStack_c38 = (secp256k1_strauss_point_state *)0x14e933;
    secp256k1_gej_set_ge(&sStack_9a8,&sStack_a10);
    if ((int)wnaf_expected == 1) {
      unaff_R12 = asStack_910;
      unaff_R13 = asStack_790;
      psVar10 = &sStack_450;
      psVar15 = &secp256k1_scalar_zero;
      psStack_c38 = (secp256k1_strauss_point_state *)0x14e993;
      sStack_b40.x.n[0] = (uint64_t)unaff_R12;
      sStack_b40.x.n[1] = (uint64_t)unaff_R13;
      sStack_b40.x.n[2] = (uint64_t)psVar10;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&sStack_b40,&sStack_aa8,1,&sStack_9a8,
                 (secp256k1_scalar *)auStack_c10,&secp256k1_scalar_zero);
      psStack_c38 = (secp256k1_strauss_point_state *)0x14e9be;
      sStack_bd8.x.n[0] = (uint64_t)unaff_R12;
      sStack_bd8.x.n[1] = (uint64_t)unaff_R13;
      sStack_bd8.x.n[2] = (uint64_t)psVar10;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&sStack_bd8,&sStack_b40,1,&sStack_9a8,
                 (secp256k1_scalar *)auStack_c30,&secp256k1_scalar_zero);
      psStack_c38 = (secp256k1_strauss_point_state *)0x14e9e6;
      auStack_c10._32_8_ = unaff_R12;
      psStack_be8 = unaff_R13;
      psStack_be0 = psVar10;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)(auStack_c10 + 0x20),&sStack_bd8,1,&sStack_9a8,
                 (secp256k1_scalar *)wnaf,&secp256k1_scalar_zero);
      psVar14 = &sStack_9a8;
    }
    else {
      psVar15 = (secp256k1_scalar *)&sStack_a10;
      psStack_c38 = (secp256k1_strauss_point_state *)0x14ea4e;
      secp256k1_ecmult_const(&sStack_aa8,(secp256k1_ge *)psVar15,(secp256k1_scalar *)auStack_c10);
      psStack_c38 = (secp256k1_strauss_point_state *)0x14ea61;
      secp256k1_ecmult_const(&sStack_b40,(secp256k1_ge *)psVar15,(secp256k1_scalar *)auStack_c30);
      psStack_c38 = (secp256k1_strauss_point_state *)0x14ea71;
      secp256k1_ecmult_const(&sStack_bd8,(secp256k1_ge *)psVar15,(secp256k1_scalar *)wnaf);
      psVar14 = (secp256k1_gej *)auStack_c30;
    }
  }
  psStack_c38 = (secp256k1_strauss_point_state *)0x14ea8b;
  secp256k1_gej_add_var(&sStack_bd8,&sStack_bd8,&sStack_aa8,(secp256k1_fe *)0x0);
  psStack_c38 = (secp256k1_strauss_point_state *)0x14eaa0;
  psVar12 = &sStack_bd8;
  secp256k1_gej_add_var(&sStack_bd8,&sStack_bd8,&sStack_b40,(secp256k1_fe *)0x0);
  psStack_c38 = (secp256k1_strauss_point_state *)0x14eaa8;
  psVar13 = &sStack_bd8;
  secp256k1_gej_verify(&sStack_bd8);
  if (sStack_bd8.infinity != 0) {
    return;
  }
  psStack_c38 = (secp256k1_strauss_point_state *)test_ecmult_constants_sha;
  test_ecmult_target_cold_1();
  out32 = (uchar *)((ulong)psVar13 & 0xffffffff);
  pcStack_da0 = (code *)0x14eaf6;
  psStack_d88 = psVar12;
  lStack_d80 = extraout_RDX;
  psStack_c60 = &sStack_bd8;
  psStack_c58 = unaff_R12;
  psStack_c50 = unaff_R13;
  psStack_c48 = (secp256k1_ge *)psVar15;
  psStack_c40 = psVar14;
  psStack_c38 = psVar10;
  scratch = secp256k1_scratch_space_create(CTX,0x10000);
  uStack_d8e = SUB84(psVar13,0);
  psVar16 = &sStack_cc8;
  sStack_cc8.s[0] = 0x6a09e667;
  sStack_cc8.s[1] = 0xbb67ae85;
  sStack_cc8.s[2] = 0x3c6ef372;
  sStack_cc8.s[3] = 0xa54ff53a;
  sStack_cc8.s[4] = 0x510e527f;
  sStack_cc8.s[5] = 0x9b05688c;
  sStack_cc8.s[6] = 0x1f83d9ab;
  sStack_cc8.s[7] = 0x5be0cd19;
  psVar12 = (secp256k1_gej *)0x0;
  sStack_cc8.bytes = 0;
  psVar15 = (secp256k1_scalar *)(auStack_d78 + 0x20);
  auStack_d78._32_8_ = 0;
  uStack_d50._0_4_ = 0;
  uStack_d50._4_4_ = 0;
  uStack_d48 = 0;
  uStack_d40 = 0;
  pcStack_da0 = (code *)0x14eb40;
  secp256k1_scalar_verify(psVar15);
  pcStack_da0 = (code *)0x14eb4e;
  test_ecmult_accumulate(psVar16,psVar15,scratch);
  auStack_d78._32_8_ = 1;
  uStack_d50._0_4_ = 0;
  uStack_d50._4_4_ = 0;
  uStack_d48 = 0;
  uStack_d40 = 0;
  pcStack_da0 = (code *)0x14eb6a;
  secp256k1_scalar_verify(psVar15);
  pcStack_da0 = (code *)0x14eb78;
  test_ecmult_accumulate(psVar16,psVar15,scratch);
  pcStack_da0 = (code *)0x14eb83;
  secp256k1_scalar_negate(psVar15,psVar15);
  pcStack_da0 = (code *)0x14eb94;
  test_ecmult_accumulate(psVar16,psVar15,scratch);
  psVar14 = psStack_d88;
  if (psStack_d88 != (secp256k1_gej *)0x0) {
    psVar12 = (secp256k1_gej *)0x0;
    psVar16 = &sStack_d38;
    out32 = auStack_d78;
    do {
      uStack_d8a = SUB82(psVar12,0);
      sStack_d38.s[0] = 0x6a09e667;
      sStack_d38.s[1] = 0xbb67ae85;
      sStack_d38.s[2] = 0x3c6ef372;
      sStack_d38.s[3] = 0xa54ff53a;
      sStack_d38.s[4] = 0x510e527f;
      sStack_d38.s[5] = 0x9b05688c;
      sStack_d38.s[6] = 0x1f83d9ab;
      sStack_d38.s[7] = 0x5be0cd19;
      sStack_d38.bytes = 0;
      pcStack_da0 = (code *)0x14ebf0;
      secp256k1_sha256_write(psVar16,(uchar *)&uStack_d8e,6);
      pcStack_da0 = (code *)0x14ebfb;
      secp256k1_sha256_finalize(psVar16,out32);
      pcStack_da0 = (code *)0x14ec08;
      secp256k1_scalar_set_b32((secp256k1_scalar *)(auStack_d78 + 0x20),out32,(int *)0x0);
      pcStack_da0 = (code *)0x14ec1b;
      test_ecmult_accumulate(&sStack_cc8,(secp256k1_scalar *)(auStack_d78 + 0x20),scratch);
      psVar12 = (secp256k1_gej *)((long)(psVar12->x).n + 1);
    } while (psVar14 != psVar12);
  }
  hash = &sStack_cc8;
  psVar7 = (secp256k1_ge *)auStack_d78;
  pcStack_da0 = (code *)0x14ec35;
  secp256k1_sha256_finalize(hash,(uchar *)psVar7);
  lVar5 = 0;
  while (auStack_d78[lVar5] == *(char *)(lStack_d80 + lVar5)) {
    lVar5 = lVar5 + 1;
    if (lVar5 == 0x20) {
      pcStack_da0 = (code *)0x14ec5d;
      secp256k1_scratch_space_destroy(CTX,scratch);
      return;
    }
  }
  pcStack_da0 = test_ecmult_accumulate;
  test_ecmult_constants_sha_cold_1();
  psStack_da8 = psVar14;
  auStack_1a50 = (undefined1  [8])0x41;
  psStack_1a68 = (secp256k1_scalar *)0x14ecad;
  psStack_dc8 = scratch;
  psStack_dc0 = psVar16;
  puStack_db8 = auStack_d78 + 0x20;
  psStack_db0 = psVar12;
  pcStack_da0 = (code *)out32;
  secp256k1_gej_set_ge(&sStack_1868,&secp256k1_ge_const_g);
  psStack_1a68 = (secp256k1_scalar *)0x14ecba;
  secp256k1_gej_set_infinity(&sStack_1900);
  psStack_1a68 = (secp256k1_scalar *)0x14ecd1;
  secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_17d0 + 1,(secp256k1_scalar *)psVar7);
  psVar10 = (secp256k1_strauss_point_state *)(asStack_1520[5].y.n + 3);
  psStack_1a68 = (secp256k1_scalar *)0x14ed23;
  sStack_1998.x.n[0] = (uint64_t)asStack_16a0;
  sStack_1998.x.n[1] = (uint64_t)asStack_1520;
  sStack_1998.x.n[2] = (uint64_t)psVar10;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&sStack_1998,&sStack_17d0,1,&sStack_1868,
             (secp256k1_scalar *)psVar7,&secp256k1_scalar_zero);
  psStack_1a68 = (secp256k1_scalar *)0x14ed53;
  auStack_1a48._0_8_ = asStack_16a0;
  auStack_1a48._8_8_ = asStack_1520;
  auStack_1a48._16_8_ = psVar10;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)auStack_1a48,&sStack_1998,1,&sStack_1900,
             &secp256k1_scalar_zero,(secp256k1_scalar *)psVar7);
  error_callback = (secp256k1_callback *)0xd0;
  psVar14 = (secp256k1_gej *)&CTX->error_callback;
  cb = (secp256k1_ecmult_multi_callback *)0x0;
  cbdata = (secp256k1_ge *)0x0;
  psStack_1a68 = (secp256k1_scalar *)0x14ed84;
  psVar15 = (secp256k1_scalar *)psVar7;
  b = scratch_00;
  iVar3 = secp256k1_ecmult_multi_var
                    ((secp256k1_callback *)psVar14,(secp256k1_scratch *)scratch_00,
                     (secp256k1_gej *)(asStack_1520[5].y.n + 3),(secp256k1_scalar *)psVar7,
                     (secp256k1_ecmult_multi_callback *)0x0,(void *)0x0,0);
  if (iVar3 == 0) {
    psStack_1a68 = (secp256k1_scalar *)0x14eee9;
    test_ecmult_accumulate_cold_8();
LAB_0014eee9:
    psStack_1a68 = (secp256k1_scalar *)0x14eeee;
    test_ecmult_accumulate_cold_7();
LAB_0014eeee:
    psStack_1a68 = (secp256k1_scalar *)0x14eef3;
    test_ecmult_accumulate_cold_6();
LAB_0014eef3:
    psStack_1a68 = (secp256k1_scalar *)0x14eef8;
    test_ecmult_accumulate_cold_5();
LAB_0014eef8:
    psStack_1a68 = (secp256k1_scalar *)0x14eefd;
    test_ecmult_accumulate_cold_4();
LAB_0014eefd:
    psStack_1a68 = (secp256k1_scalar *)0x14ef02;
    test_ecmult_accumulate_cold_3();
LAB_0014ef02:
    psStack_1a68 = (secp256k1_scalar *)0x14ef07;
    test_ecmult_accumulate_cold_2();
  }
  else {
    error_callback = &CTX->error_callback;
    psVar15 = &secp256k1_scalar_zero;
    cb = test_ecmult_accumulate_cb;
    psStack_1a68 = (secp256k1_scalar *)0x14edbf;
    b = scratch_00;
    psVar14 = (secp256k1_gej *)error_callback;
    cbdata = psVar7;
    iVar3 = secp256k1_ecmult_multi_var
                      (error_callback,(secp256k1_scratch *)scratch_00,asStack_1520,
                       &secp256k1_scalar_zero,test_ecmult_accumulate_cb,psVar7,1);
    if (iVar3 == 0) goto LAB_0014eee9;
    psStack_1a68 = (secp256k1_scalar *)0x14edde;
    secp256k1_ecmult_const(asStack_16a0,&secp256k1_ge_const_g,(secp256k1_scalar *)psVar7);
    psVar7 = (secp256k1_ge *)auStack_1a48;
    psStack_1a68 = (secp256k1_scalar *)0x14edf3;
    secp256k1_ge_set_gej_var(psVar7,&sStack_17d0 + 1);
    psVar14 = &sStack_17d0;
    psStack_1a68 = (secp256k1_scalar *)0x14ee03;
    b = psVar7;
    iVar3 = secp256k1_gej_eq_ge_var(psVar14,psVar7);
    if (iVar3 == 0) goto LAB_0014eeee;
    psVar14 = &sStack_1998;
    b = (secp256k1_ge *)auStack_1a48;
    psStack_1a68 = (secp256k1_scalar *)0x14ee1d;
    iVar3 = secp256k1_gej_eq_ge_var(psVar14,b);
    if (iVar3 == 0) goto LAB_0014eef3;
    psVar14 = (secp256k1_gej *)(asStack_1520[5].y.n + 3);
    b = (secp256k1_ge *)auStack_1a48;
    psStack_1a68 = (secp256k1_scalar *)0x14ee37;
    iVar3 = secp256k1_gej_eq_ge_var(psVar14,b);
    if (iVar3 == 0) goto LAB_0014eef8;
    psVar14 = asStack_1520;
    b = (secp256k1_ge *)auStack_1a48;
    psStack_1a68 = (secp256k1_scalar *)0x14ee51;
    iVar3 = secp256k1_gej_eq_ge_var(psVar14,b);
    if (iVar3 == 0) goto LAB_0014eefd;
    psVar14 = asStack_16a0;
    b = (secp256k1_ge *)auStack_1a48;
    psStack_1a68 = (secp256k1_scalar *)0x14ee6b;
    iVar3 = secp256k1_gej_eq_ge_var(psVar14,b);
    if (iVar3 == 0) goto LAB_0014ef02;
    psStack_1a68 = (secp256k1_scalar *)0x14ee80;
    secp256k1_ge_verify((secp256k1_ge *)auStack_1a48);
    if (auStack_1a48._96_4_ != 0) {
      auStack_1a48[0x68] = 0;
      sVar8 = 1;
LAB_0014eec8:
      psStack_1a68 = (secp256k1_scalar *)0x14eed2;
      secp256k1_sha256_write(hash,auStack_1a48 + 0x68,sVar8);
      return;
    }
    psVar14 = (secp256k1_gej *)auStack_1a48;
    b = (secp256k1_ge *)(auStack_1a48 + 0x68);
    psVar7 = (secp256k1_ge *)auStack_1a50;
    psVar15 = (secp256k1_scalar *)0x0;
    psStack_1a68 = (secp256k1_scalar *)0x14eeb5;
    secp256k1_eckey_pubkey_serialize((secp256k1_ge *)psVar14,(uchar *)b,(size_t *)psVar7,0);
    if (auStack_1a50 == (undefined1  [8])0x41) {
      sVar8 = 0x41;
      goto LAB_0014eec8;
    }
  }
  psStack_1a68 = (secp256k1_scalar *)secp256k1_ecmult_multi_var;
  test_ecmult_accumulate_cold_1();
  psStack_1a68 = &secp256k1_scalar_zero;
  psStack_1a90 = asStack_16a0;
  psStack_1a88 = error_callback;
  psStack_1a78 = psVar7;
  psStack_1a70 = psVar10;
  secp256k1_gej_set_infinity(r);
  if ((secp256k1_ge *)psVar15 != (secp256k1_ge *)0x0 || hash != (secp256k1_sha256 *)0x0) {
    if (hash == (secp256k1_sha256 *)0x0) {
      sStack_2380.aux = asStack_1f58;
      sStack_2380.pre_a = asStack_1dd8;
      sStack_2380.ps = &sStack_2368;
      secp256k1_ecmult_strauss_wnaf(&sStack_2380,r,1,r,&secp256k1_scalar_zero,psVar15);
    }
    else {
      if ((b == (secp256k1_ge *)0x0) ||
         (sVar8 = secp256k1_pippenger_max_points
                            ((secp256k1_callback *)psVar14,(secp256k1_scratch *)b), sVar8 == 0)) {
LAB_0014f136:
        secp256k1_ecmult_multi_simple_var(r,psVar15,cb,cbdata,(size_t)hash);
        return;
      }
      uVar4 = 5000000;
      if (sVar8 < 5000000) {
        uVar4 = sVar8;
      }
      puVar1 = (undefined1 *)((long)&hash[-1].bytes + 7);
      uStack_2388 = (ulong)puVar1 / uVar4 + 1;
      uVar4 = (ulong)puVar1 / uStack_2388;
      if (uVar4 < 0x57) {
        lVar5 = 0;
        do {
          if (*(char *)((long)(b->x).n + lVar5) != "scratch"[lVar5]) {
            (*(code *)(psVar14->x).n[0])("invalid scratch space",(psVar14->x).n[1]);
            goto LAB_0014f136;
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != 8);
        uVar9 = (b->x).n[3] - (b->x).n[2];
        uVar4 = 0;
        if (0x4a < uVar9) {
          uVar4 = uVar9 - 0x4b;
        }
        if (uVar4 < 0x988) goto LAB_0014f136;
        uVar4 = uVar4 / 0x988;
        if (4999999 < uVar4) {
          uVar4 = 5000000;
        }
        uStack_2388 = (ulong)puVar1 / uVar4 + 1;
        uVar4 = (ulong)puVar1 / uStack_2388;
        pcVar6 = secp256k1_ecmult_strauss_batch;
      }
      else {
        pcVar6 = secp256k1_ecmult_pippenger_batch;
      }
      psVar16 = (secp256k1_sha256 *)(uVar4 + 1);
      lVar5 = 0;
      uVar4 = 0;
      do {
        psVar11 = psVar16;
        if (hash < psVar16) {
          psVar11 = hash;
        }
        psVar7 = (secp256k1_ge *)0x0;
        if (uVar4 == 0) {
          psVar7 = (secp256k1_ge *)psVar15;
        }
        iVar3 = (*pcVar6)(psVar14,b,&sStack_2368,psVar7,cb,cbdata,psVar11,lVar5);
        if (iVar3 == 0) {
          return;
        }
        secp256k1_gej_add_var(r,r,(secp256k1_gej *)&sStack_2368,(secp256k1_fe *)0x0);
        hash = (secp256k1_sha256 *)((long)hash - (long)psVar11);
        uVar4 = uVar4 + 1;
        lVar5 = (long)psVar16->s + lVar5;
      } while (uStack_2388 != uVar4);
    }
  }
  return;
}

Assistant:

static void test_fixed_wnaf_small_helper(int *wnaf, int *wnaf_expected, int w) {
    int i;
    for (i = WNAF_SIZE(w)-1; i >= 8; --i) {
        CHECK(wnaf[i] == 0);
    }
    for (i = 7; i >= 0; --i) {
        CHECK(wnaf[i] == wnaf_expected[i]);
    }
}